

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int blobSeekToRow(Incrblob *p,sqlite3_int64 iRow,char **pzErr)

{
  ushort uVar1;
  Vdbe *p_00;
  Mem *pMVar2;
  VdbeCursor *pVVar3;
  sqlite3 *db;
  BtCursor *pBVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  
  p_00 = (Vdbe *)p->pStmt;
  pMVar2 = p_00->aMem;
  pMVar2[1].flags = 4;
  pMVar2[1].u.i = iRow;
  if (p_00->pc < 5) {
    iVar5 = sqlite3_step(p->pStmt);
  }
  else {
    p_00->pc = 4;
    iVar5 = sqlite3VdbeExec(p_00);
  }
  if (iVar5 == 100) {
    pVVar3 = *p_00->apCsr;
    uVar1 = p->iCol;
    if (uVar1 < pVVar3->nHdrParsed) {
      uVar7 = pVVar3->aType[uVar1];
      if (0xb < uVar7) {
        p->iOffset = pVVar3->aType[(long)pVVar3->nField + (ulong)uVar1];
        if (uVar7 < 0x80) {
          uVar7 = (uint)""[uVar7];
        }
        else {
          uVar7 = uVar7 - 0xc >> 1;
        }
        p->nByte = uVar7;
        pBVar4 = (pVVar3->uc).pCursor;
        p->pCsr = pBVar4;
        pBVar4->curFlags = pBVar4->curFlags | 0x10;
        pBVar4->pBtree->hasIncrblobCur = '\x01';
        pcVar6 = (char *)0x0;
        iVar5 = 0;
        goto LAB_00127df3;
      }
      pcVar8 = "integer";
      if (uVar7 == 7) {
        pcVar8 = "real";
      }
      pcVar6 = "null";
      if (uVar7 != 0) {
        pcVar6 = pcVar8;
      }
    }
    else {
      pcVar6 = "null";
    }
    pcVar6 = sqlite3MPrintf(p->db,"cannot open value of type %s",pcVar6);
    sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
  }
  else {
    if (p->pStmt == (sqlite3_stmt *)0x0) {
      pcVar6 = (char *)0x0;
      goto LAB_00127df3;
    }
    iVar5 = sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
    db = p->db;
    if (iVar5 != 0) {
      pcVar6 = sqlite3_errmsg(db);
      pcVar6 = sqlite3MPrintf(db,"%s",pcVar6);
      goto LAB_00127df3;
    }
    pcVar6 = sqlite3MPrintf(db,"no such rowid: %lld",iRow);
  }
  iVar5 = 1;
LAB_00127df3:
  *pzErr = pcVar6;
  return iVar5;
}

Assistant:

static int blobSeekToRow(Incrblob *p, sqlite3_int64 iRow, char **pzErr){
  int rc;                         /* Error code */
  char *zErr = 0;                 /* Error message */
  Vdbe *v = (Vdbe *)p->pStmt;

  /* Set the value of register r[1] in the SQL statement to integer iRow. 
  ** This is done directly as a performance optimization
  */
  v->aMem[1].flags = MEM_Int;
  v->aMem[1].u.i = iRow;

  /* If the statement has been run before (and is paused at the OP_ResultRow)
  ** then back it up to the point where it does the OP_NotExists.  This could
  ** have been down with an extra OP_Goto, but simply setting the program
  ** counter is faster. */
  if( v->pc>4 ){
    v->pc = 4;
    assert( v->aOp[v->pc].opcode==OP_NotExists );
    rc = sqlite3VdbeExec(v);
  }else{
    rc = sqlite3_step(p->pStmt);
  }
  if( rc==SQLITE_ROW ){
    VdbeCursor *pC = v->apCsr[0];
    u32 type = pC->nHdrParsed>p->iCol ? pC->aType[p->iCol] : 0;
    testcase( pC->nHdrParsed==p->iCol );
    testcase( pC->nHdrParsed==p->iCol+1 );
    if( type<12 ){
      zErr = sqlite3MPrintf(p->db, "cannot open value of type %s",
          type==0?"null": type==7?"real": "integer"
      );
      rc = SQLITE_ERROR;
      sqlite3_finalize(p->pStmt);
      p->pStmt = 0;
    }else{
      p->iOffset = pC->aType[p->iCol + pC->nField];
      p->nByte = sqlite3VdbeSerialTypeLen(type);
      p->pCsr =  pC->uc.pCursor;
      sqlite3BtreeIncrblobCursor(p->pCsr);
    }
  }

  if( rc==SQLITE_ROW ){
    rc = SQLITE_OK;
  }else if( p->pStmt ){
    rc = sqlite3_finalize(p->pStmt);
    p->pStmt = 0;
    if( rc==SQLITE_OK ){
      zErr = sqlite3MPrintf(p->db, "no such rowid: %lld", iRow);
      rc = SQLITE_ERROR;
    }else{
      zErr = sqlite3MPrintf(p->db, "%s", sqlite3_errmsg(p->db));
    }
  }

  assert( rc!=SQLITE_OK || zErr==0 );
  assert( rc!=SQLITE_ROW && rc!=SQLITE_DONE );

  *pzErr = zErr;
  return rc;
}